

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_decoding.cc
# Opt level: O3

void __thiscall sptk::HuffmanDecoding::HuffmanDecoding(HuffmanDecoding *this,ifstream *input_stream)

{
  char cVar1;
  undefined1 *puVar2;
  long lVar3;
  Node *pNVar4;
  istream *piVar5;
  Node *pNVar6;
  long lVar7;
  int symbol;
  string bits;
  int local_64;
  Node **local_60;
  ifstream *local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  this->_vptr_HuffmanDecoding = (_func_int **)&PTR__HuffmanDecoding_0010fcc8;
  this->is_valid_ = true;
  this->root_ = (Node *)0x0;
  this->curr_node_ = (Node *)0x0;
  if (input_stream == (ifstream *)0x0) {
    this->is_valid_ = false;
  }
  else {
    local_58 = input_stream;
    pNVar4 = (Node *)operator_new(0x18);
    local_60 = &this->root_;
    *local_60 = pNVar4;
    pNVar4->left = (Node *)0x0;
    pNVar4->right = (Node *)0x0;
    local_50 = local_40;
    local_48 = 0;
    local_40[0] = 0;
    while( true ) {
      piVar5 = (istream *)std::istream::operator>>((istream *)local_58,&local_64);
      piVar5 = std::operator>>(piVar5,(string *)&local_50);
      lVar3 = local_48;
      puVar2 = local_50;
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
      pNVar4 = *local_60;
      if (local_48 != 0) {
        lVar7 = 0;
        pNVar6 = pNVar4;
        do {
          cVar1 = puVar2[lVar7];
          pNVar4 = pNVar6;
          if (cVar1 == '1') {
            pNVar4 = (Node *)&pNVar6->right;
          }
          pNVar4 = pNVar4->left;
          if (pNVar4 == (Node *)0x0) {
            pNVar4 = (Node *)operator_new(0x18);
            pNVar4->left = (Node *)0x0;
            pNVar4->right = (Node *)0x0;
            if (cVar1 == '1') {
              pNVar6 = (Node *)&pNVar6->right;
            }
            pNVar6->left = pNVar4;
          }
          lVar7 = lVar7 + 1;
          pNVar6 = pNVar4;
        } while (lVar3 != lVar7);
      }
      pNVar4->symbol = local_64;
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    this->curr_node_ = this->root_;
  }
  return;
}

Assistant:

HuffmanDecoding::HuffmanDecoding(std::ifstream* input_stream)
    : is_valid_(true), root_(NULL), curr_node_(NULL) {
  if (NULL == input_stream) {
    is_valid_ = false;
    return;
  }

  try {
    root_ = new Node;
    root_->left = NULL;
    root_->right = NULL;

    int symbol;
    std::string bits;
    while (*input_stream >> symbol >> bits) {
      Node* node(root_);
      for (const char& bit : bits) {
        const bool right('1' == bit ? true : false);
        Node* next_node(right ? node->right : node->left);
        if (NULL == next_node) {
          next_node = new Node;
          next_node->left = NULL;
          next_node->right = NULL;
          if (right) {
            node->right = next_node;
          } else {
            node->left = next_node;
          }
        }
        node = next_node;
      }
      node->symbol = symbol;
    }
  } catch (...) {
    Free(root_);
    is_valid_ = false;
    return;
  }

  curr_node_ = root_;
}